

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddGroup.c
# Opt level: O2

int zddGroupSiftingUp(DdManager *table,int y,int xLow,Move **moves)

{
  DdHalfWord x;
  Move *pMVar1;
  DdHalfWord x_00;
  uint uVar2;
  DdNode *pDVar3;
  Move *pMVar4;
  uint uVar5;
  
  uVar5 = table->keysZ;
  x_00 = cuddZddNextLow(table,y);
  do {
    if ((int)x_00 < xLow) {
      return 1;
    }
    x = table->subtableZ[(int)x_00].next;
    if ((x == x_00) && (table->subtableZ[y].next == y)) {
      uVar2 = cuddZddSwapInPlace(table,x_00,y);
      if ((uVar2 == 0) || (pDVar3 = cuddDynamicAllocNode(table), pDVar3 == (DdNode *)0x0)) {
LAB_00753373:
        pMVar4 = *moves;
        while (pMVar4 != (Move *)0x0) {
          pMVar1 = pMVar4->next;
          pMVar4->y = 0;
          *(DdNode **)&pMVar4->flags = table->nextFree;
          table->nextFree = (DdNode *)*moves;
          *moves = pMVar1;
          pMVar4 = pMVar1;
        }
        return 0;
      }
      pDVar3->index = x_00;
      pDVar3->ref = y;
      *(undefined4 *)&pDVar3->next = 0;
      *(uint *)((long)&pDVar3->next + 4) = uVar2;
      (pDVar3->type).kids.T = (DdNode *)*moves;
      *moves = (Move *)pDVar3;
    }
    else {
      uVar2 = zddGroupMove(table,x_00,y,moves);
      if (uVar2 == 0) goto LAB_00753373;
    }
    if ((double)(int)uVar5 * table->maxGrowth < (double)(int)uVar2) {
      return 1;
    }
    if ((int)uVar2 < (int)uVar5) {
      uVar5 = uVar2;
    }
    x_00 = cuddZddNextLow(table,x);
    y = x;
  } while( true );
}

Assistant:

static int
zddGroupSiftingUp(
  DdManager * table,
  int  y,
  int  xLow,
  Move ** moves)
{
    Move *move;
    int  x;
    int  size;
    int  gxtop;
    int  limitSize;

    limitSize = table->keysZ;

    x = cuddZddNextLow(table,y);
    while (x >= xLow) {
        gxtop = table->subtableZ[x].next;
        if (table->subtableZ[x].next == (unsigned) x &&
            table->subtableZ[y].next == (unsigned) y) {
            /* x and y are self groups */
            size = cuddZddSwapInPlace(table,x,y);
#ifdef DD_DEBUG
            assert(table->subtableZ[x].next == (unsigned) x);
            assert(table->subtableZ[y].next == (unsigned) y);
#endif
            if (size == 0) goto zddGroupSiftingUpOutOfMem;
            move = (Move *)cuddDynamicAllocNode(table);
            if (move == NULL) goto zddGroupSiftingUpOutOfMem;
            move->x = x;
            move->y = y;
            move->flags = MTR_DEFAULT;
            move->size = size;
            move->next = *moves;
            *moves = move;

#ifdef DD_DEBUG
            if (pr > 0) (void) fprintf(table->out,"zddGroupSiftingUp (2 single groups):\n");
#endif
            if ((double) size > (double) limitSize * table->maxGrowth)
                return(1);
            if (size < limitSize) limitSize = size;
        } else { /* group move */
            size = zddGroupMove(table,x,y,moves);
            if (size == 0) goto zddGroupSiftingUpOutOfMem;
            if ((double) size > (double) limitSize * table->maxGrowth)
                return(1);
            if (size < limitSize) limitSize = size;
        }
        y = gxtop;
        x = cuddZddNextLow(table,y);
    }

    return(1);

zddGroupSiftingUpOutOfMem:
    while (*moves != NULL) {
        move = (*moves)->next;
        cuddDeallocMove(table, *moves);
        *moves = move;
    }
    return(0);

}